

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void recff_ffi_fill(jit_State *J,RecordFFData *rd)

{
  ushort uVar1;
  uint uVar2;
  TRef *pTVar3;
  CType *pCVar4;
  IRRef1 IVar5;
  TRef TVar6;
  TRef TVar7;
  uint uVar8;
  TRef TVar9;
  cTValue *pcVar10;
  IROpT IVar11;
  int iVar12;
  CTSize CVar13;
  uint uVar14;
  uint uVar15;
  int32_t k;
  CType *pCVar16;
  CTSize *pCVar17;
  uint uVar18;
  CTState *cts;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  CTSize sz;
  CTSize local_138 [66];
  
  pTVar3 = J->base;
  TVar6 = *pTVar3;
  TVar7 = pTVar3[1];
  if (TVar7 == 0 || TVar6 == 0) {
    return;
  }
  cts = (CTState *)(ulong)J[-1].bpropcache[9].mode;
  TVar9 = pTVar3[2];
  pcVar10 = rd->argv;
  if ((pcVar10->field_2).it == 0xfffffff5) {
    uVar1 = *(ushort *)((ulong)(pcVar10->u32).lo + 6);
    pCVar4 = cts->tab;
    pCVar16 = pCVar4 + uVar1;
    if ((pCVar4[uVar1].info & 0xf0000000) == 0x20000000) {
      pCVar16 = pCVar4 + (ushort)pCVar16->info;
    }
    lj_ctype_info(cts,(CTypeID)((ulong)((long)pCVar16 - (long)pCVar4) >> 4),local_138);
  }
  TVar6 = crec_ct_tv(J,cts->tab + 0x11,0,TVar6,pcVar10);
  TVar7 = crec_ct_tv(J,cts->tab + 9,0,TVar7,rd->argv + 1);
  if (TVar9 == 0) {
    uVar8 = lj_ir_kint(J,0);
  }
  else {
    uVar8 = crec_ct_tv(J,cts->tab + 9,0,TVar9,rd->argv + 2);
  }
  uVar22 = (ulong)uVar8;
  rd->nres = 0;
  if (-1 < (short)TVar7) {
    uVar2 = (J->cur).ir[TVar7 & 0x7fff].field_1.op12;
    if (uVar2 == 0) {
      iVar12 = 1;
    }
    else {
      iVar12 = 2;
      if (uVar2 < 0x81) {
        CVar13 = 0x16;
        uVar14 = 0;
        uVar15 = 8;
        uVar19 = 0;
        do {
          if (uVar14 + uVar15 <= uVar2) {
            uVar20 = uVar19;
            if ((uint)uVar19 < 0x11) {
              uVar20 = 0x10;
            }
            pCVar17 = local_138 + uVar19 * 4 + 1;
            lVar21 = 0;
            do {
              if (uVar19 - uVar20 == lVar21) {
                uVar18 = 0;
                goto LAB_00135aa1;
              }
              pCVar17[-1] = uVar14;
              *pCVar17 = CVar13;
              lVar21 = lVar21 + -1;
              pCVar17 = pCVar17 + 4;
              uVar14 = uVar14 + uVar15;
            } while (uVar15 + uVar14 <= uVar2);
            uVar19 = (ulong)((uint)uVar19 - (int)lVar21);
          }
          uVar18 = (uint)uVar19;
          uVar15 = uVar15 >> 1;
          CVar13 = CVar13 - 2;
        } while (uVar14 < uVar2);
LAB_00135aa1:
        if (uVar18 == 0) {
          iVar12 = 2;
        }
        else {
          if (local_138[1] != 0x10 || -1 < (short)(IRRef1)uVar8) {
            (J->fold).ins.field_0.op1 = (IRRef1)uVar8;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55130270;
            TVar9 = lj_opt_fold(J);
            uVar22 = (ulong)TVar9;
          }
          if (local_138[1] != 0x10) {
            if (local_138[1] == 0x16) {
              if (-1 < (short)(IRRef1)uVar22) {
                (J->fold).ins.field_0.op1 = (IRRef1)uVar22;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x551602d4;
                TVar9 = lj_opt_fold(J);
                uVar22 = (ulong)TVar9;
              }
              pcVar10 = lj_ir_k64_find(J,0x101010101010101);
              TVar9 = lj_ir_k64(J,IR_KINT64,pcVar10);
              IVar5 = (IRRef1)TVar9;
              IVar11 = 0x2a16;
            }
            else {
              k = 0x1010101;
              if (local_138[1] == 0x12) {
                k = 0x101;
              }
              TVar9 = lj_ir_kint(J,k);
              IVar5 = (IRRef1)TVar9;
              IVar11 = 0x2a13;
            }
            (J->fold).ins.field_0.ot = IVar11;
            (J->fold).ins.field_0.op1 = (IRRef1)uVar22;
            (J->fold).ins.field_0.op2 = IVar5;
            TVar9 = lj_opt_fold(J);
            uVar22 = (ulong)TVar9;
          }
          lVar21 = 0;
          do {
            pcVar10 = lj_ir_k64_find(J,(ulong)*(uint *)((long)local_138 + lVar21));
            TVar9 = lj_ir_k64(J,IR_KINT64,pcVar10);
            (J->fold).ins.field_0.ot = 0x2809;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            TVar9 = lj_opt_fold(J);
            (J->fold).ins.field_0.ot =
                 (ushort)*(undefined4 *)((long)local_138 + lVar21 + 4) | 0x4b00;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
            (J->fold).ins.field_0.op2 = (IRRef1)uVar22;
            lj_opt_fold(J);
            lVar21 = lVar21 + 0x10;
          } while ((ulong)uVar18 << 4 != lVar21);
          iVar12 = 0;
        }
      }
    }
    if (iVar12 == 0) goto LAB_00135c38;
    if (iVar12 == 1) {
      return;
    }
  }
  lj_ir_call(J,IRCALL_memset,(ulong)TVar6,uVar22,(ulong)TVar7);
LAB_00135c38:
  (J->fold).ins.field_0.ot = 0x5400;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_fill(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trlen = J->base[1], trfill = J->base[2];
  if (trdst && trlen) {
    CTSize step = 1;
    if (tviscdata(&rd->argv[0])) {  /* Get alignment of original destination. */
      CTSize sz;
      CType *ct = ctype_raw(cts, cdataV(&rd->argv[0])->ctypeid);
      if (ctype_isptr(ct->info))
	ct = ctype_rawchild(cts, ct);
      step = (1u<<ctype_align(lj_ctype_info(cts, ctype_typeid(cts, ct), &sz)));
    }
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
    if (trfill)
      trfill = crec_toint(J, cts, trfill, &rd->argv[2]);
    else
      trfill = lj_ir_kint(J, 0);
    rd->nres = 0;
    crec_fill(J, trdst, trlen, trfill, step);
  }  /* else: interpreter will throw. */
}